

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_2d_avx2.h
# Opt level: O0

void convolve_2d_sr_hor_8tap_avx2
               (uint8_t *src,int32_t src_stride,int32_t w,int32_t h,
               InterpFilterParams *filter_params_x,int32_t subpel_x_q4,int16_t *im_block)

{
  __m256i res_00;
  uint8_t *puVar1;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  uint8_t *puVar2;
  undefined8 uVar3;
  longlong lVar4;
  undefined8 uVar5;
  long in_stack_00000008;
  __m256i res;
  __m256i filt_256 [4];
  __m256i coeffs_256 [4];
  int16_t *im;
  int32_t y;
  uint8_t *src_ptr;
  uint8_t local_220 [32];
  __m256i *in_stack_fffffffffffffe00;
  undefined4 in_stack_fffffffffffffe08;
  int32_t in_stack_fffffffffffffe0c;
  InterpFilterParams *in_stack_fffffffffffffe10;
  ptrdiff_t in_stack_fffffffffffffe18;
  uint8_t *in_stack_fffffffffffffe20;
  uint8_t local_1c0 [8];
  uint8_t auStack_1b8 [8];
  uint8_t auStack_1b0 [8];
  int16_t *dst;
  __m256i *filt;
  __m256i *coeffs;
  __m256i *res_01;
  undefined1 local_140 [136];
  long local_b8;
  int local_ac;
  long local_a8;
  int local_88;
  int local_84;
  uint8_t *local_78;
  uint8_t *local_70;
  uint8_t *local_68;
  uint8_t *local_60;
  uint8_t *local_58;
  uint8_t *local_50;
  undefined1 *local_48;
  int local_3c;
  long local_38;
  
  local_a8 = in_RDI + -3;
  local_b8 = in_stack_00000008;
  local_60 = "";
  local_1c0[0] = '\0';
  local_1c0[1] = '\x01';
  local_1c0[2] = '\x01';
  local_1c0[3] = '\x02';
  local_1c0[4] = '\x02';
  local_1c0[5] = '\x03';
  local_1c0[6] = '\x03';
  local_1c0[7] = '\x04';
  auStack_1b8[0] = '\x04';
  auStack_1b8[1] = '\x05';
  auStack_1b8[2] = '\x05';
  auStack_1b8[3] = '\x06';
  auStack_1b8[4] = '\x06';
  auStack_1b8[5] = '\a';
  auStack_1b8[6] = '\a';
  auStack_1b8[7] = '\b';
  auStack_1b0[0] = '\0';
  auStack_1b0[1] = '\x01';
  auStack_1b0[2] = '\x01';
  auStack_1b0[3] = '\x02';
  auStack_1b0[4] = '\x02';
  auStack_1b0[5] = '\x03';
  auStack_1b0[6] = '\x03';
  auStack_1b0[7] = '\x04';
  dst = (int16_t *)0x807070606050504;
  local_68 = 
  "\x02\x03\x03\x04\x04\x05\x05\x06\x06\a\a\b\b\t\t\n\x02\x03\x03\x04\x04\x05\x05\x06\x06\a\a\b\b\t\t\n"
  ;
  filt = (__m256i *)0x605050404030302;
  coeffs = (__m256i *)0xa09090808070706;
  res_01 = (__m256i *)0x605050404030302;
  local_70 = "\x04\x05\x05\x06\x06\a\a\b\b\t\t\n\n\v\v\f\x04\x05\x05\x06\x06\a\a\b\b\t\t\n\n\v\v\f";
  local_78 = "\x06\a\a\b\b\t\t\n\n\v\v\f\f\r\r\x0e\x06\a\a\b\b\t\t\n\n\v\v\f\f\r\r\x0e";
  puVar2 = (uint8_t *)0xa09090808070706;
  uVar3._0_1_ = '\n';
  uVar3._1_1_ = '\v';
  uVar3._2_1_ = '\v';
  uVar3._3_1_ = '\f';
  uVar3._4_1_ = '\f';
  uVar3._5_1_ = '\r';
  uVar3._6_1_ = '\r';
  uVar3._7_1_ = '\x0e';
  lVar4 = 0;
  uVar5 = 0;
  local_ac = in_ECX;
  local_88 = in_EDX;
  local_84 = in_ESI;
  prepare_half_coeffs_8tap_avx2
            (in_stack_fffffffffffffe10,in_stack_fffffffffffffe0c,in_stack_fffffffffffffe00);
  if (local_88 == 8) {
    do {
      x_convolve_8tap_8x2_avx2
                (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
                 (__m256i *)in_stack_fffffffffffffe10,
                 (__m256i *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
      res_00[1] = (longlong)puVar2;
      res_00[0] = in_stack_fffffffffffffe18;
      res_00[2]._0_1_ = (uint8_t)uVar3;
      res_00[2]._1_1_ = SUB81(uVar3,1);
      res_00[2]._2_1_ = SUB81(uVar3,2);
      res_00[2]._3_1_ = SUB81(uVar3,3);
      res_00[2]._4_1_ = SUB81(uVar3,4);
      res_00[2]._5_1_ = SUB81(uVar3,5);
      res_00[2]._6_1_ = SUB81(uVar3,6);
      res_00[2]._7_1_ = SUB81(uVar3,7);
      res_00[3] = lVar4;
      in_stack_fffffffffffffe20 = puVar2;
      xy_x_round_store_8x2_avx2(res_00,(int16_t *)in_stack_fffffffffffffe10);
      local_a8 = local_a8 + (local_84 << 1);
      local_b8 = local_b8 + 0x20;
      local_ac = local_ac + -2;
    } while (local_ac != 0);
  }
  else if (local_88 == 0x10) {
    do {
      local_48 = local_140;
      local_50 = local_1c0;
      local_38 = local_a8;
      local_3c = local_84;
      local_58 = local_220;
      x_convolve_8tap_8x2_avx2
                (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
                 (__m256i *)in_stack_fffffffffffffe10,
                 (__m256i *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
      puVar1 = local_58;
      *(uint8_t **)local_58 = puVar2;
      *(undefined8 *)(puVar1 + 8) = uVar3;
      *(longlong *)(puVar1 + 0x10) = lVar4;
      *(undefined8 *)(puVar1 + 0x18) = uVar5;
      x_convolve_8tap_8x2_avx2
                (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
                 (__m256i *)in_stack_fffffffffffffe10,
                 (__m256i *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
      puVar1 = local_58;
      *(uint8_t **)(local_58 + 0x20) = puVar2;
      *(undefined8 *)(puVar1 + 0x28) = uVar3;
      *(longlong *)(puVar1 + 0x30) = lVar4;
      *(undefined8 *)(puVar1 + 0x38) = uVar5;
      lVar4 = 0;
      uVar5 = 0;
      xy_x_round_store_32_avx2(res_01,(int16_t *)coeffs);
      local_a8 = local_a8 + (local_84 << 1);
      local_b8 = local_b8 + 0x40;
      local_ac = local_ac + -2;
    } while (local_ac != 0);
  }
  else if (local_88 == 0x20) {
    do {
      xy_x_8tap_32_avx2((uint8_t *)res_01,coeffs,filt,dst);
      local_a8 = local_a8 + local_84;
      local_b8 = local_b8 + 0x40;
      local_ac = local_ac + -1;
    } while (local_ac != 0);
  }
  else if (local_88 == 0x40) {
    do {
      xy_x_8tap_32_avx2((uint8_t *)res_01,coeffs,filt,dst);
      xy_x_8tap_32_avx2((uint8_t *)res_01,coeffs,filt,dst);
      local_a8 = local_a8 + local_84;
      local_b8 = local_b8 + 0x80;
      local_ac = local_ac + -1;
    } while (local_ac != 0);
  }
  else {
    do {
      xy_x_8tap_32_avx2((uint8_t *)res_01,coeffs,filt,dst);
      xy_x_8tap_32_avx2((uint8_t *)res_01,coeffs,filt,dst);
      xy_x_8tap_32_avx2((uint8_t *)res_01,coeffs,filt,dst);
      xy_x_8tap_32_avx2((uint8_t *)res_01,coeffs,filt,dst);
      local_a8 = local_a8 + local_84;
      local_b8 = local_b8 + 0x100;
      local_ac = local_ac + -1;
    } while (local_ac != 0);
  }
  return;
}

Assistant:

static void convolve_2d_sr_hor_8tap_avx2(
    const uint8_t *const src, const int32_t src_stride, const int32_t w,
    const int32_t h, const InterpFilterParams *const filter_params_x,
    const int32_t subpel_x_q4, int16_t *const im_block) {
  const uint8_t *src_ptr = src - 3;
  int32_t y = h;
  int16_t *im = im_block;
  __m256i coeffs_256[4], filt_256[4];

  filt_256[0] = _mm256_loadu_si256((__m256i const *)filt1_global_avx2);
  filt_256[1] = _mm256_loadu_si256((__m256i const *)filt2_global_avx2);
  filt_256[2] = _mm256_loadu_si256((__m256i const *)filt3_global_avx2);
  filt_256[3] = _mm256_loadu_si256((__m256i const *)filt4_global_avx2);

  prepare_half_coeffs_8tap_avx2(filter_params_x, subpel_x_q4, coeffs_256);

  if (w == 8) {
    do {
      const __m256i res =
          x_convolve_8tap_8x2_avx2(src_ptr, src_stride, coeffs_256, filt_256);
      xy_x_round_store_8x2_avx2(res, im);
      src_ptr += 2 * src_stride;
      im += 2 * 8;
      y -= 2;
    } while (y);
  } else if (w == 16) {
    do {
      __m256i r[2];

      x_convolve_8tap_16x2_avx2(src_ptr, src_stride, coeffs_256, filt_256, r);
      xy_x_round_store_32_avx2(r, im);
      src_ptr += 2 * src_stride;
      im += 2 * 16;
      y -= 2;
    } while (y);
  } else if (w == 32) {
    do {
      xy_x_8tap_32_avx2(src_ptr, coeffs_256, filt_256, im);
      src_ptr += src_stride;
      im += 32;
    } while (--y);
  } else if (w == 64) {
    do {
      xy_x_8tap_32_avx2(src_ptr, coeffs_256, filt_256, im);
      xy_x_8tap_32_avx2(src_ptr + 32, coeffs_256, filt_256, im + 32);
      src_ptr += src_stride;
      im += 64;
    } while (--y);
  } else {
    assert(w == 128);

    do {
      xy_x_8tap_32_avx2(src_ptr, coeffs_256, filt_256, im);
      xy_x_8tap_32_avx2(src_ptr + 32, coeffs_256, filt_256, im + 32);
      xy_x_8tap_32_avx2(src_ptr + 64, coeffs_256, filt_256, im + 64);
      xy_x_8tap_32_avx2(src_ptr + 96, coeffs_256, filt_256, im + 96);
      src_ptr += src_stride;
      im += 128;
    } while (--y);
  }
}